

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.cpp
# Opt level: O3

FP3 * __thiscall BaseFixture::urandFP3(FP3 *__return_storage_ptr__,BaseFixture *this,FP3 a,FP3 b)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  
  iVar1 = rand();
  iVar2 = rand();
  auVar3._0_8_ = (double)iVar1 * (b.x - a.x);
  auVar3._8_8_ = (double)iVar2 * (b.y - a.y);
  auVar3 = divpd(auVar3,_DAT_001cdb40);
  __return_storage_ptr__->x = auVar3._0_8_ + a.x;
  __return_storage_ptr__->y = auVar3._8_8_ + a.y;
  iVar1 = rand();
  __return_storage_ptr__->z = ((double)iVar1 * (b.z - a.z)) / 2147483647.0 + a.z;
  return __return_storage_ptr__;
}

Assistant:

FP3 BaseFixture::urandFP3(FP3 a, FP3 b) {
    FP3 result;
    result.x = urand(a.x, b.x);
    result.y = urand(a.y, b.y);
    result.z = urand(a.z, b.z);
    return result;
}